

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int authorize(mg_connection *conn,mg_file *filep,char *realm)

{
  byte *pbVar1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  ulonglong uVar6;
  ulong uVar7;
  size_t sVar8;
  uchar *puVar9;
  ushort *puVar10;
  ah *paVar11;
  uchar uVar12;
  mg_context *ctx;
  uchar *puVar13;
  ulong uVar14;
  bool bVar15;
  char buf [8192];
  uchar *local_22e8;
  char *local_22e0;
  mg_file *local_22d8;
  read_auth_file_struct local_22d0;
  uchar local_2038 [8200];
  
  if (conn->dom_ctx == (mg_domain_context *)0x0) {
    iVar2 = 0;
  }
  else {
    memset(&local_22d0,0,0x298);
    local_22d0.ah.user = (char *)0x0;
    local_22d0.ah.type = 0;
    local_22d0.ah._12_4_ = 0;
    local_22d0.ah.plain_password = (char *)0x0;
    local_22d0.ah.uri = (char *)0x0;
    local_22d0.ah.cnonce = (char *)0x0;
    local_22d0.ah.response = (char *)0x0;
    local_22d0.ah.qop = (char *)0x0;
    local_22d0.ah.nc = (char *)0x0;
    local_22d0.ah.nonce = (char *)0x0;
    local_22d0.conn = conn;
    pcVar3 = mg_get_header(conn,"Authorization");
    bVar15 = false;
    if (pcVar3 != (char *)0x0) {
      iVar2 = mg_strncasecmp(pcVar3,"Basic ",6);
      if (iVar2 == 0) {
        sVar8 = strlen(pcVar3 + 6);
        local_22e8 = (uchar *)0x2000;
        iVar2 = mg_base64_decode(pcVar3 + 6,sVar8,local_2038,(size_t *)&local_22e8);
        bVar15 = false;
        if (iVar2 == -1) {
          pcVar3 = strchr((char *)local_2038,0x3a);
          if (pcVar3 != (char *)0x0) {
            *pcVar3 = '\0';
            local_22d0.ah.type = 1;
            local_22d0.ah.plain_password = pcVar3 + 1;
            bVar15 = true;
            local_22d0.ah.user = (char *)local_2038;
          }
        }
      }
      else {
        iVar2 = mg_strncasecmp(pcVar3,"Digest ",7);
        bVar15 = false;
        if (iVar2 == 0) {
          local_22d0.ah.type = 2;
          uVar12 = pcVar3[7];
          local_22e8 = local_2038;
          puVar9 = local_22e8;
          if (uVar12 != '\0') {
            puVar13 = (uchar *)(pcVar3 + 8);
            puVar9 = local_2038;
            uVar14 = 0x1fff;
            do {
              *puVar9 = uVar12;
              puVar9 = puVar9 + 1;
              uVar12 = *puVar13;
              if (uVar12 == '\0') break;
              puVar13 = puVar13 + 1;
              bVar15 = 1 < uVar14;
              uVar14 = uVar14 - 1;
            } while (bVar15);
          }
          *puVar9 = '\0';
          local_22e0 = realm;
          local_22d8 = filep;
          ppuVar4 = __ctype_b_loc();
          while( true ) {
            puVar10 = *ppuVar4;
            local_22e8 = local_22e8 + -1;
            do {
              pbVar1 = local_22e8 + 1;
              local_22e8 = local_22e8 + 1;
            } while ((*(byte *)((long)puVar10 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
            pcVar3 = skip_quoted((char **)&local_22e8,"=",(char *)0x0,(char)puVar10);
            if (*local_22e8 == '\"') {
              local_22e8 = local_22e8 + 1;
              pcVar5 = skip_quoted((char **)&local_22e8,"\"",(char *)0x5c,(char)puVar10);
              if (*local_22e8 == ',') {
                local_22e8 = local_22e8 + 1;
              }
            }
            else {
              pcVar5 = skip_quoted((char **)&local_22e8,", ",(char *)0x0,(char)puVar10);
            }
            if (*pcVar3 == '\0') break;
            iVar2 = strcmp(pcVar3,"username");
            paVar11 = &local_22d0.ah;
            if (iVar2 == 0) goto LAB_0010f8fe;
            iVar2 = strcmp(pcVar3,"cnonce");
            paVar11 = (ah *)&local_22d0.ah.cnonce;
            if (iVar2 == 0) goto LAB_0010f8fe;
            iVar2 = strcmp(pcVar3,"response");
            paVar11 = (ah *)&local_22d0.ah.response;
            if (iVar2 == 0) goto LAB_0010f8fe;
            iVar2 = strcmp(pcVar3,"uri");
            paVar11 = (ah *)&local_22d0.ah.uri;
            if (iVar2 == 0) goto LAB_0010f8fe;
            iVar2 = strcmp(pcVar3,"qop");
            paVar11 = (ah *)&local_22d0.ah.qop;
            if (iVar2 == 0) goto LAB_0010f8fe;
            iVar2 = strcmp(pcVar3,"nc");
            paVar11 = (ah *)&local_22d0.ah.nc;
            if (iVar2 == 0) goto LAB_0010f8fe;
            iVar2 = strcmp(pcVar3,"nonce");
            paVar11 = (ah *)&local_22d0.ah.nonce;
            if (iVar2 == 0) {
LAB_0010f8fe:
              paVar11->user = pcVar5;
            }
          }
          bVar15 = false;
          realm = local_22e0;
          filep = local_22d8;
          if (local_22d0.ah.nonce != (char *)0x0) {
            local_22e8 = (uchar *)0x0;
            uVar6 = strtoull(local_22d0.ah.nonce,(char **)&local_22e8,10);
            realm = local_22e0;
            filep = local_22d8;
            if ((local_22e8 != (uchar *)0x0) && (*local_22e8 == '\0')) {
              uVar7 = uVar6 ^ conn->dom_ctx->auth_nonce_mask;
              uVar14 = conn->phys_ctx->start_time;
              if ((uVar14 <= uVar7) && (uVar7 < uVar14 + conn->dom_ctx->nonce_count)) {
                bVar15 = (uchar *)local_22d0.ah.user != (uchar *)0x0;
              }
            }
          }
        }
      }
    }
    pcVar3 = local_22d0.ah.user;
    iVar2 = 0;
    if (bVar15) {
      sVar8 = strlen(local_22d0.ah.user);
      pcVar3 = mg_strndup_ctx(pcVar3,sVar8,ctx);
      (conn->request_info).remote_user = pcVar3;
      if (realm == (char *)0x0) {
        realm = conn->dom_ctx->config[0x1e];
      }
      local_22d0.domain = realm;
      iVar2 = read_auth_file(filep,&local_22d0,9);
    }
  }
  return iVar2;
}

Assistant:

static int
authorize(struct mg_connection *conn, struct mg_file *filep, const char *realm)
{
	struct read_auth_file_struct workdata;
	char buf[MG_BUF_LEN];

	if (!conn || !conn->dom_ctx) {
		return 0;
	}

	memset(&workdata, 0, sizeof(workdata));
	workdata.conn = conn;

	if (!parse_auth_header(conn, buf, sizeof(buf), &workdata.ah)) {
		return 0;
	}

	/* CGI needs it as REMOTE_USER */
	conn->request_info.remote_user =
	    mg_strdup_ctx(workdata.ah.user, conn->phys_ctx);

	if (realm) {
		workdata.domain = realm;
	} else {
		workdata.domain = conn->dom_ctx->config[AUTHENTICATION_DOMAIN];
	}

	return read_auth_file(filep, &workdata, INITIAL_DEPTH);
}